

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.cpp
# Opt level: O1

void __thiscall cppcms::impl::cgi::connection::cgi_forwarder::write_post(cgi_forwarder *this)

{
  size_type __new_size;
  element_type *peVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  pointer pcVar5;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_> local_48;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_> local_40;
  __shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder,(__gnu_cxx::_Lock_policy)2> local_38 [8]
  ;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  __new_size = this->content_length_;
  if (0 < (long)__new_size) {
    if ((long)__new_size <
        (long)(this->post_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this->post_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start) {
      std::vector<char,_std::allocator<char>_>::resize(&this->post_,__new_size);
    }
    peVar1 = (this->conn_).
             super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pcVar2 = (this->post_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar3 = (this->post_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    std::__shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder,void>
              (local_38,(__weak_ptr<cppcms::impl::cgi::connection::cgi_forwarder,_(__gnu_cxx::_Lock_policy)2>
                         *)this);
    mfunc_to_io_handler<cppcms::impl::cgi::connection::cgi_forwarder,std::shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder>>
              ((offset_in_cgi_forwarder_to_subr)&local_48,
               (shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder> *)on_post_data_read);
    local_40.p_ = local_48.p_;
    if (local_48.p_ != (callable<void_(const_std::error_code_&,_unsigned_long)> *)0x0) {
      booster::atomic_counter::inc();
    }
    (*peVar1->_vptr_connection[0x11])(peVar1,pcVar2,(long)pcVar3 - (long)pcVar2,&local_40);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
    ~intrusive_ptr(&local_40);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
    ~intrusive_ptr(&local_48);
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
    }
    return;
  }
  pcVar2 = (this->response_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->response_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (this->post_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
       ._M_end_of_storage;
  pcVar3 = (this->response_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar4 = (this->response_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar5 = (this->post_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->response_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (this->post_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->response_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = pcVar5;
  (this->post_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = pcVar3;
  (this->post_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = pcVar4;
  (this->post_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pcVar2;
  std::vector<char,_std::allocator<char>_>::resize(&this->response_,0x2000);
  read_response(this);
  return;
}

Assistant:

void write_post()
		{
			if(content_length_ > 0) {
				if(content_length_ <  (long long)(post_.size())) {
					post_.resize(content_length_);
				}
				conn_->async_read_some(&post_.front(),post_.size(),
					mfunc_to_io_handler(&cgi_forwarder::on_post_data_read,shared_from_this()));
			}
			else {
				response_.swap(post_);
				response_.resize(8192);
				read_response();
			}
		}